

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_error_strerror.c
# Opt level: O0

char * zip_error_strerror(zip_error_t *err)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_d8;
  long local_c8;
  char *s;
  char buf [128];
  char *ss;
  char *zs;
  zip_error_t *err_local;
  
  zip_error_fini(err);
  if ((err->zip_err < 0) || (0x20 < err->zip_err)) {
    sprintf((char *)&s,"Unknown error %d",(ulong)(uint)err->zip_err);
    ss = (char *)0x0;
    buf._120_8_ = &s;
  }
  else {
    ss = _zip_err_str[err->zip_err];
    if (_zip_err_type[err->zip_err] == 1) {
      buf._120_8_ = strerror(err->sys_err);
    }
    else if (_zip_err_type[err->zip_err] == 2) {
      buf._120_8_ = zError(err->sys_err);
    }
    else {
      buf[0x78] = '\0';
      buf[0x79] = '\0';
      buf[0x7a] = '\0';
      buf[0x7b] = '\0';
      buf[0x7c] = '\0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
    }
  }
  if (buf._120_8_ == 0) {
    err_local = (zip_error_t *)ss;
  }
  else {
    sVar1 = strlen((char *)buf._120_8_);
    if (ss == (char *)0x0) {
      local_c8 = 0;
    }
    else {
      sVar2 = strlen(ss);
      local_c8 = sVar2 + 2;
    }
    err_local = (zip_error_t *)malloc(sVar1 + local_c8 + 1);
    if (err_local == (zip_error_t *)0x0) {
      err_local = (zip_error_t *)anon_var_dwarf_2876f;
    }
    else {
      if (ss == (char *)0x0) {
        local_d8 = "";
      }
      else {
        local_d8 = ss;
      }
      pcVar3 = "";
      if (ss != (char *)0x0) {
        pcVar3 = ": ";
      }
      sprintf((char *)err_local,"%s%s%s",local_d8,pcVar3,buf._120_8_);
      err->str = (char *)err_local;
    }
  }
  return (char *)err_local;
}

Assistant:

ZIP_EXTERN const char *
zip_error_strerror(zip_error_t *err) {
    const char *zs, *ss;
    char buf[128], *s;

    zip_error_fini(err);

    if (err->zip_err < 0 || err->zip_err >= _zip_nerr_str) {
	sprintf(buf, "Unknown error %d", err->zip_err);
	zs = NULL;
	ss = buf;
    }
    else {
	zs = _zip_err_str[err->zip_err];

	switch (_zip_err_type[err->zip_err]) {
	case ZIP_ET_SYS:
	    ss = strerror(err->sys_err);
	    break;

	case ZIP_ET_ZLIB:
	    ss = zError(err->sys_err);
	    break;

	default:
	    ss = NULL;
	}
    }

    if (ss == NULL)
	return zs;
    else {
	if ((s = (char *)malloc(strlen(ss) + (zs ? strlen(zs) + 2 : 0) + 1)) == NULL)
	    return _zip_err_str[ZIP_ER_MEMORY];

	sprintf(s, "%s%s%s", (zs ? zs : ""), (zs ? ": " : ""), ss);
	err->str = s;

	return s;
    }
}